

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint getHash(uchar *data,size_t size,size_t pos)

{
  bool bVar1;
  undefined8 uVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  ushort uVar7;
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar8 [16];
  
  if (pos + 2 < size) {
    uVar5 = (uint)data[pos + 2] << 8 ^ (uint)data[pos + 1] << 4 ^ (uint)data[pos];
  }
  else {
    if (size < pos || size - pos == 0) {
      return 0;
    }
    auVar11 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar12 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar13 = vpmovsxbd_avx512f(_DAT_003ea500);
    auVar14 = vpbroadcastq_avx512f(ZEXT816(0x10));
    auVar15 = vpbroadcastd_avx512f(ZEXT416(0x10));
    auVar19 = ZEXT1664((undefined1  [16])0x0);
    uVar6 = 0;
    auVar16 = vpbroadcastq_avx512f();
    do {
      uVar2 = vpcmpuq_avx512f(auVar12,auVar16,2);
      bVar3 = (byte)uVar2;
      uVar2 = vpcmpuq_avx512f(auVar11,auVar16,2);
      bVar4 = (byte)uVar2;
      auVar17 = vmovdqa64_avx512f(auVar19);
      auVar19 = vpslld_avx512f(auVar13,3);
      auVar12 = vpaddq_avx512f(auVar12,auVar14);
      auVar11 = vpaddq_avx512f(auVar11,auVar14);
      auVar13 = vpaddd_avx512f(auVar13,auVar15);
      uVar7 = CONCAT11(bVar4,bVar3);
      auVar8 = vmovdqu8_avx512vl(*(undefined1 (*) [16])(data + uVar6 + pos));
      auVar9[1] = ((byte)(uVar7 >> 1) & 1) * auVar8[1];
      auVar9[0] = (bVar3 & 1) * auVar8[0];
      auVar9[2] = ((byte)(uVar7 >> 2) & 1) * auVar8[2];
      auVar9[3] = ((byte)(uVar7 >> 3) & 1) * auVar8[3];
      auVar9[4] = ((byte)(uVar7 >> 4) & 1) * auVar8[4];
      auVar9[5] = ((byte)(uVar7 >> 5) & 1) * auVar8[5];
      auVar9[6] = ((byte)(uVar7 >> 6) & 1) * auVar8[6];
      auVar9[7] = ((byte)(uVar7 >> 7) & 1) * auVar8[7];
      auVar9[8] = (bVar4 & 1) * auVar8[8];
      auVar9[9] = (bVar4 >> 1 & 1) * auVar8[9];
      auVar9[10] = (bVar4 >> 2 & 1) * auVar8[10];
      auVar9[0xb] = (bVar4 >> 3 & 1) * auVar8[0xb];
      auVar9[0xc] = (bVar4 >> 4 & 1) * auVar8[0xc];
      auVar9[0xd] = (bVar4 >> 5 & 1) * auVar8[0xd];
      auVar9[0xe] = (bVar4 >> 6 & 1) * auVar8[0xe];
      auVar9[0xf] = -((char)bVar4 >> 7) * auVar8[0xf];
      uVar6 = uVar6 + 0x10;
      auVar18 = vpmovzxbd_avx512f(auVar9);
      auVar19 = vpsllvd_avx512f(auVar18,auVar19);
      auVar19 = vpxord_avx512f(auVar19,auVar17);
    } while (((size - pos) + 0xf & 0xfffffffffffffff0) != uVar6);
    auVar11 = vmovdqa32_avx512f(auVar19);
    auVar12._0_4_ = (uint)(bVar3 & 1) * auVar11._0_4_ | (uint)!(bool)(bVar3 & 1) * auVar17._0_4_;
    bVar1 = (bool)((byte)(uVar7 >> 1) & 1);
    auVar12._4_4_ = (uint)bVar1 * auVar11._4_4_ | (uint)!bVar1 * auVar17._4_4_;
    bVar1 = (bool)((byte)(uVar7 >> 2) & 1);
    auVar12._8_4_ = (uint)bVar1 * auVar11._8_4_ | (uint)!bVar1 * auVar17._8_4_;
    bVar1 = (bool)((byte)(uVar7 >> 3) & 1);
    auVar12._12_4_ = (uint)bVar1 * auVar11._12_4_ | (uint)!bVar1 * auVar17._12_4_;
    bVar1 = (bool)((byte)(uVar7 >> 4) & 1);
    auVar12._16_4_ = (uint)bVar1 * auVar11._16_4_ | (uint)!bVar1 * auVar17._16_4_;
    bVar1 = (bool)((byte)(uVar7 >> 5) & 1);
    auVar12._20_4_ = (uint)bVar1 * auVar11._20_4_ | (uint)!bVar1 * auVar17._20_4_;
    bVar1 = (bool)((byte)(uVar7 >> 6) & 1);
    auVar12._24_4_ = (uint)bVar1 * auVar11._24_4_ | (uint)!bVar1 * auVar17._24_4_;
    bVar1 = (bool)((byte)(uVar7 >> 7) & 1);
    auVar12._28_4_ = (uint)bVar1 * auVar11._28_4_ | (uint)!bVar1 * auVar17._28_4_;
    auVar12._32_4_ = (uint)(bVar4 & 1) * auVar11._32_4_ | (uint)!(bool)(bVar4 & 1) * auVar17._32_4_;
    bVar1 = (bool)(bVar4 >> 1 & 1);
    auVar12._36_4_ = (uint)bVar1 * auVar11._36_4_ | (uint)!bVar1 * auVar17._36_4_;
    bVar1 = (bool)(bVar4 >> 2 & 1);
    auVar12._40_4_ = (uint)bVar1 * auVar11._40_4_ | (uint)!bVar1 * auVar17._40_4_;
    bVar1 = (bool)(bVar4 >> 3 & 1);
    auVar12._44_4_ = (uint)bVar1 * auVar11._44_4_ | (uint)!bVar1 * auVar17._44_4_;
    bVar1 = (bool)(bVar4 >> 4 & 1);
    auVar12._48_4_ = (uint)bVar1 * auVar11._48_4_ | (uint)!bVar1 * auVar17._48_4_;
    bVar1 = (bool)(bVar4 >> 5 & 1);
    auVar12._52_4_ = (uint)bVar1 * auVar11._52_4_ | (uint)!bVar1 * auVar17._52_4_;
    bVar1 = (bool)(bVar4 >> 6 & 1);
    auVar12._56_4_ = (uint)bVar1 * auVar11._56_4_ | (uint)!bVar1 * auVar17._56_4_;
    auVar12._60_4_ =
         (uint)(bVar4 >> 7) * auVar11._60_4_ | (uint)!(bool)(bVar4 >> 7) * auVar17._60_4_;
    auVar10 = vextracti64x4_avx512f(auVar12,1);
    auVar11 = vpxord_avx512f(auVar12,ZEXT3264(auVar10));
    auVar9 = auVar11._0_16_ ^ auVar11._16_16_;
    auVar8 = vpshufd_avx(auVar9,0xee);
    auVar9 = auVar9 ^ auVar8;
    auVar8 = vpshufd_avx(auVar9,0x55);
    uVar5 = auVar9._0_4_ ^ auVar8._0_4_;
  }
  return uVar5 & 0xffff;
}

Assistant:

static unsigned getHash(const unsigned char* data, size_t size, size_t pos)
{
  unsigned result = 0;
  if(pos + 2 < size)
  {
    /*A simple shift and xor hash is used. Since the data of PNGs is dominated
    by zeroes due to the filters, a better hash does not have a significant
    effect on speed in traversing the chain, and causes more time spend on
    calculating the hash.*/
    result ^= (unsigned)(data[pos + 0] << 0u);
    result ^= (unsigned)(data[pos + 1] << 4u);
    result ^= (unsigned)(data[pos + 2] << 8u);
  } else {
    size_t amount, i;
    if(pos >= size) return 0;
    amount = size - pos;
    for(i = 0; i != amount; ++i) result ^= (unsigned)(data[pos + i] << (i * 8u));
  }
  return result & HASH_BIT_MASK;
}